

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O1

void * Col_StringBufferReserve(Col_Word strbuf,size_t length)

{
  uint uVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  
  if (strbuf == 0) {
    uVar1 = 0;
  }
  else if ((strbuf & 0xf) == 0) {
    uVar1 = -(uint)((*(byte *)strbuf & 2) == 0) | *(byte *)strbuf & 0xfffffffe;
  }
  else {
    uVar1 = immediateWordTypes[(uint)strbuf & 0x1f];
  }
  if ((uVar1 == 2) && ((*(byte *)(strbuf + 2) & 0xc) == 0)) {
    strbuf = *(Col_Word *)(strbuf + 0x10);
  }
  if (length == 0) {
    pvVar3 = (void *)0x0;
  }
  else {
    uVar4 = (ulong)(*(byte *)(strbuf + 1) & 7);
    pvVar3 = (void *)0x0;
    uVar2 = ((ulong)*(ushort *)(strbuf + 2) * 0x20 - 0x18) / uVar4;
    if (length <= uVar2) {
      if (uVar2 - *(long *)(strbuf + 0x10) < length) {
        CommitBuffer(strbuf);
      }
      pvVar3 = (void *)(strbuf + uVar4 * *(long *)(strbuf + 0x10) + 0x18);
      *(size_t *)(strbuf + 0x10) = length + *(long *)(strbuf + 0x10);
    }
  }
  return pvVar3;
}

Assistant:

void *
Col_StringBufferReserve(
    Col_Word strbuf,    /*!< String buffer to reserve into. */
    size_t length)      /*!< Number of characters to reserve. Must be <=
                             [Col_StringBufferCapacity(strbuf)](@ref Col_StringBufferCapacity).
                         */
{
    Col_StringFormat format;
    size_t maxLength;
    const char *data;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return NULL;

    WORD_UNWRAP(strbuf);

    if (length == 0) {
        /*
        * No-op.
        */

        return NULL;
    }

    format = (Col_StringFormat) WORD_STRBUF_FORMAT(strbuf);
    maxLength = STRBUF_MAX_LENGTH(WORD_STRBUF_SIZE(strbuf) * CELL_SIZE,
            format);
    if (length > maxLength) {
        /*
         * Not enough room.
         */

        return NULL;
    }

    ASSERT(WORD_STRBUF_LENGTH(strbuf) <= maxLength);
    if (length > maxLength - WORD_STRBUF_LENGTH(strbuf)) {
        /*
         * Not enough remaining space, commit buffer first.
         */

        /*!
         * @sideeffect
         * May commit buffer.
         */
        CommitBuffer(strbuf);
        ASSERT(WORD_STRBUF_LENGTH(strbuf) == 0);
    }

    /*
     * Reserve area by shifting current length.
     */

    ASSERT(WORD_STRBUF_LENGTH(strbuf) + length <= maxLength);
    data = WORD_STRBUF_BUFFER(strbuf)
            + CHAR_WIDTH(format) * WORD_STRBUF_LENGTH(strbuf);
    WORD_STRBUF_LENGTH(strbuf) += length;
    return (void *) data;
}